

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blackhole-server.c
# Opt level: O0

int run_helper_tcp4_blackhole_server(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int r;
  uv_loop_t *loop;
  sockaddr_in addr;
  
  loop_00 = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&loop);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/blackhole-server.c"
            ,0x6a,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_tcp_init(loop_00,&tcp_server);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/blackhole-server.c"
            ,0x6d,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&loop,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/blackhole-server.c"
            ,0x70,"r == 0");
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&tcp_server,0x80,connection_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/blackhole-server.c"
            ,0x73,"r == 0");
    abort();
  }
  notify_parent_process();
  uv_run(loop_00,UV_RUN_DEFAULT);
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/blackhole-server.c"
          ,0x77,"0 && \"Blackhole server dropped out of event loop.\"");
  abort();
}

Assistant:

HELPER_IMPL(tcp4_blackhole_server) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, &tcp_server);
  ASSERT(r == 0);

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&tcp_server, 128, connection_cb);
  ASSERT(r == 0);

  notify_parent_process();
  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(0 && "Blackhole server dropped out of event loop.");

  return 0;
}